

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O2

void ncnn::im2col_sgemm_pack1to4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int *piVar13;
  int iVar14;
  _func_int ***ppp_Var15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  undefined4 *puVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  ulong uVar28;
  float *pfVar29;
  long lVar30;
  undefined1 (*pauVar31) [16];
  int q;
  ulong uVar32;
  undefined4 *puVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 local_b8 [64];
  size_t local_78;
  ulong local_70;
  ulong local_68;
  Mat *local_60;
  long local_58;
  void *local_50;
  float zeros [4];
  
  uVar5 = bottom_im2col->w;
  uVar19 = (ulong)(int)uVar5;
  uVar6 = bottom_im2col->h;
  uVar26 = bottom_im2col->c;
  local_68 = (ulong)(uint)top_blob->c;
  local_50 = _bias->data;
  local_78 = 0;
  local_b8._0_8_ = (Allocator *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8._24_4_ = 0;
  local_b8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar19 < 8) {
    uVar21 = uVar6;
    uVar24 = uVar5;
    if (3 < (int)uVar5) {
      uVar21 = uVar6 * 4;
      uVar24 = (uVar5 & 3) + 1;
    }
  }
  else {
    uVar21 = uVar6 * 8;
    uVar24 = (uVar5 & 3) + (uVar5 >> 3) + (uint)((uVar5 >> 2 & 1) != 0);
  }
  local_b8._32_8_ = local_b8._0_8_;
  local_b8._40_4_ = local_b8._8_4_;
  local_b8._44_4_ = local_b8._12_4_;
  local_60 = top_blob;
  Mat::create((Mat *)local_b8,uVar21,uVar26,uVar24,4,1,opt->workspace_allocator);
  uVar16 = 0;
  uVar21 = 0;
  if (0 < (int)uVar6) {
    uVar21 = uVar6;
  }
  uVar28 = 0;
  if (0 < (int)uVar26) {
    uVar28 = (ulong)uVar26;
  }
  uVar17 = (ulong)(uint)((int)uVar5 >> 3);
  if ((int)uVar5 >> 3 < 1) {
    uVar17 = uVar16;
  }
  lVar22 = 0x10;
  for (; uVar16 != uVar17; uVar16 = uVar16 + 1) {
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ + local_78 * uVar16 * local_b8._16_8_);
    for (uVar32 = 0; uVar32 != uVar28; uVar32 = uVar32 + 1) {
      sVar7 = bottom_im2col->cstep;
      sVar8 = bottom_im2col->elemsize;
      lVar20 = (long)bottom_im2col->data + lVar22;
      uVar24 = uVar21;
      while (bVar35 = uVar24 != 0, uVar24 = uVar24 - 1, bVar35) {
        *(undefined1 (*) [32])ppp_Var15 =
             *(undefined1 (*) [32])(lVar20 + -0x10 + sVar7 * sVar8 * uVar32);
        ppp_Var15 = ppp_Var15 + 4;
        lVar20 = lVar20 + uVar19 * 4;
      }
    }
    lVar22 = lVar22 + 0x20;
  }
  uVar24 = uVar5 >> 2 & 1;
  lVar22 = (uVar19 & 0xfffffffffffffff8) << 2;
  for (uVar16 = 0; iVar14 = (int)(uVar19 & 0xfffffffffffffff8), uVar16 != uVar24;
      uVar16 = uVar16 + 1) {
    iVar14 = iVar14 + (int)uVar16 * 4;
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)((iVar14 % 8 >> 2) + iVar14 / 8) * local_78 * local_b8._16_8_);
    for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
      pauVar31 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar17 + lVar22);
      uVar25 = uVar21;
      while (bVar35 = uVar25 != 0, uVar25 = uVar25 - 1, bVar35) {
        *(undefined1 (*) [16])ppp_Var15 = *pauVar31;
        ppp_Var15 = ppp_Var15 + 2;
        pauVar31 = (undefined1 (*) [16])(*pauVar31 + uVar19 * 4);
      }
    }
    lVar22 = lVar22 + 0x10;
  }
  local_58 = local_78 * local_b8._16_8_;
  uVar16 = (ulong)(int)(iVar14 + uVar24 * 4);
  lVar22 = uVar16 * 4;
  for (; (long)uVar16 < (long)uVar19; uVar16 = uVar16 + 1) {
    uVar24 = (int)uVar16 >> 0x1f;
    uVar17 = (ulong)uVar24 << 0x20 | uVar16 & 0xffffffff;
    sVar7 = bottom_im2col->cstep;
    sVar8 = bottom_im2col->elemsize;
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                ((int)((long)((ulong)uVar24 << 0x20 | uVar16 & 0xffffffff) % 4) +
                 (int)((long)uVar17 / 8) + (int)(char)((char)((long)uVar17 % 8) / '\x04')) *
                local_58);
    puVar33 = (undefined4 *)((long)bottom_im2col->data + lVar22);
    for (uVar17 = 0; puVar23 = puVar33, uVar24 = uVar21, uVar17 != uVar28; uVar17 = uVar17 + 1) {
      while (uVar24 != 0) {
        *(undefined4 *)ppp_Var15 = *puVar23;
        ppp_Var15 = (_func_int ***)((long)ppp_Var15 + 4);
        puVar23 = puVar23 + uVar19;
        uVar24 = uVar24 - 1;
      }
      puVar33 = (undefined4 *)((long)puVar33 + sVar7 * sVar8);
    }
    lVar22 = lVar22 + 4;
  }
  uVar28 = 0;
  uVar16 = (ulong)(uVar26 * uVar6);
  if ((int)(uVar26 * uVar6) < 1) {
    uVar16 = uVar28;
  }
  uVar17 = local_68 & 0xffffffff;
  if ((int)local_68 < 1) {
    uVar17 = uVar28;
  }
  for (; uVar28 != uVar17; uVar28 = uVar28 + 1) {
    pauVar18 = (undefined1 (*) [16])
               (local_60->cstep * uVar28 * local_60->elemsize + (long)local_60->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    pauVar31 = (undefined1 (*) [16])(uVar28 * 0x10 + (long)local_50);
    if (local_50 == (void *)0x0) {
      pauVar31 = (undefined1 (*) [16])zeros;
    }
    lVar22 = 0;
    for (uVar32 = 0; (long)(uVar32 | 7) < (long)uVar19; uVar32 = uVar32 + 8) {
      lVar30 = local_78 * local_b8._16_8_ * lVar22;
      auVar36 = *pauVar31;
      lVar20 = 0;
      uVar34 = uVar16;
      auVar39 = auVar36;
      auVar42 = auVar36;
      auVar45 = auVar36;
      auVar38 = auVar36;
      auVar41 = auVar36;
      auVar44 = auVar36;
      auVar47 = auVar36;
      while (iVar14 = (int)uVar34, uVar34 = (ulong)(iVar14 - 1), iVar14 != 0) {
        pfVar29 = (float *)((long)kernel->data + lVar20 + kernel->cstep * uVar28 * kernel->elemsize)
        ;
        fVar2 = *pfVar29;
        fVar3 = pfVar29[1];
        fVar4 = pfVar29[2];
        fVar9 = pfVar29[3];
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar20 * 2 + lVar30);
        auVar37._0_4_ = fVar1 * fVar2 + auVar36._0_4_;
        auVar37._4_4_ = fVar1 * fVar3 + auVar36._4_4_;
        auVar37._8_4_ = fVar1 * fVar4 + auVar36._8_4_;
        auVar37._12_4_ = fVar1 * fVar9 + auVar36._12_4_;
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar20 * 2 + lVar30 + 4);
        auVar40._0_4_ = fVar1 * fVar2 + auVar39._0_4_;
        auVar40._4_4_ = fVar1 * fVar3 + auVar39._4_4_;
        auVar40._8_4_ = fVar1 * fVar4 + auVar39._8_4_;
        auVar40._12_4_ = fVar1 * fVar9 + auVar39._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar20 * 2 + lVar30);
        auVar43._0_4_ = fVar1 * fVar2 + auVar42._0_4_;
        auVar43._4_4_ = fVar1 * fVar3 + auVar42._4_4_;
        auVar43._8_4_ = fVar1 * fVar4 + auVar42._8_4_;
        auVar43._12_4_ = fVar1 * fVar9 + auVar42._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar20 * 2 + lVar30 + 4);
        auVar46._0_4_ = fVar1 * fVar2 + auVar45._0_4_;
        auVar46._4_4_ = fVar1 * fVar3 + auVar45._4_4_;
        auVar46._8_4_ = fVar1 * fVar4 + auVar45._8_4_;
        auVar46._12_4_ = fVar1 * fVar9 + auVar45._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar20 * 2 + lVar30);
        auVar48._0_4_ = fVar1 * fVar2 + auVar38._0_4_;
        auVar48._4_4_ = fVar1 * fVar3 + auVar38._4_4_;
        auVar48._8_4_ = fVar1 * fVar4 + auVar38._8_4_;
        auVar48._12_4_ = fVar1 * fVar9 + auVar38._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar20 * 2 + lVar30 + 4);
        auVar49._0_4_ = fVar1 * fVar2 + auVar41._0_4_;
        auVar49._4_4_ = fVar1 * fVar3 + auVar41._4_4_;
        auVar49._8_4_ = fVar1 * fVar4 + auVar41._8_4_;
        auVar49._12_4_ = fVar1 * fVar9 + auVar41._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar20 * 2 + lVar30);
        auVar50._0_4_ = fVar1 * fVar2 + auVar44._0_4_;
        auVar50._4_4_ = fVar1 * fVar3 + auVar44._4_4_;
        auVar50._8_4_ = fVar1 * fVar4 + auVar44._8_4_;
        auVar50._12_4_ = fVar1 * fVar9 + auVar44._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar20 * 2 + lVar30 + 4);
        auVar51._0_4_ = fVar1 * fVar2 + auVar47._0_4_;
        auVar51._4_4_ = fVar1 * fVar3 + auVar47._4_4_;
        auVar51._8_4_ = fVar1 * fVar4 + auVar47._8_4_;
        auVar51._12_4_ = fVar1 * fVar9 + auVar47._12_4_;
        lVar20 = lVar20 + 0x10;
        auVar36 = auVar37;
        auVar39 = auVar40;
        auVar42 = auVar43;
        auVar45 = auVar46;
        auVar38 = auVar48;
        auVar41 = auVar49;
        auVar44 = auVar50;
        auVar47 = auVar51;
      }
      *pauVar18 = auVar36;
      pauVar18[1] = auVar39;
      pauVar18[2] = auVar42;
      pauVar18[3] = auVar45;
      pauVar18[4] = auVar38;
      pauVar18[5] = auVar41;
      pauVar18[6] = auVar44;
      pauVar18[7] = auVar47;
      pauVar18 = pauVar18 + 8;
      lVar22 = lVar22 + 1;
    }
    bVar27 = 0;
    for (; (int)((uint)uVar32 | 3) < (int)uVar5; uVar32 = (ulong)((uint)uVar32 + 4)) {
      lVar20 = local_78 * local_b8._16_8_ *
               (ulong)((bVar27 & 1) + ((uint)(uVar32 >> 3) & 0x1fffffff));
      auVar36 = *pauVar31;
      lVar22 = 0;
      uVar34 = uVar16;
      auVar39 = auVar36;
      auVar42 = auVar36;
      auVar45 = auVar36;
      while (iVar14 = (int)uVar34, uVar34 = (ulong)(iVar14 - 1), iVar14 != 0) {
        pfVar29 = (float *)((long)kernel->data + lVar22 + kernel->cstep * uVar28 * kernel->elemsize)
        ;
        fVar9 = *pfVar29;
        fVar10 = pfVar29[1];
        fVar11 = pfVar29[2];
        fVar12 = pfVar29[3];
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar22 + lVar20);
        fVar2 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar22 + lVar20 + 4);
        fVar3 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar22 + lVar20);
        fVar4 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar22 + lVar20 + 4);
        auVar38._0_4_ = fVar1 * fVar9 + auVar36._0_4_;
        auVar38._4_4_ = fVar1 * fVar10 + auVar36._4_4_;
        auVar38._8_4_ = fVar1 * fVar11 + auVar36._8_4_;
        auVar38._12_4_ = fVar1 * fVar12 + auVar36._12_4_;
        auVar41._0_4_ = fVar2 * fVar9 + auVar39._0_4_;
        auVar41._4_4_ = fVar2 * fVar10 + auVar39._4_4_;
        auVar41._8_4_ = fVar2 * fVar11 + auVar39._8_4_;
        auVar41._12_4_ = fVar2 * fVar12 + auVar39._12_4_;
        auVar44._0_4_ = fVar3 * fVar9 + auVar42._0_4_;
        auVar44._4_4_ = fVar3 * fVar10 + auVar42._4_4_;
        auVar44._8_4_ = fVar3 * fVar11 + auVar42._8_4_;
        auVar44._12_4_ = fVar3 * fVar12 + auVar42._12_4_;
        auVar47._0_4_ = fVar4 * fVar9 + auVar45._0_4_;
        auVar47._4_4_ = fVar4 * fVar10 + auVar45._4_4_;
        auVar47._8_4_ = fVar4 * fVar11 + auVar45._8_4_;
        auVar47._12_4_ = fVar4 * fVar12 + auVar45._12_4_;
        lVar22 = lVar22 + 0x10;
        auVar36 = auVar38;
        auVar39 = auVar41;
        auVar42 = auVar44;
        auVar45 = auVar47;
      }
      *pauVar18 = auVar36;
      pauVar18[1] = auVar39;
      pauVar18[2] = auVar42;
      pauVar18[3] = auVar45;
      pauVar18 = pauVar18 + 4;
      bVar27 = bVar27 + 1;
    }
    while( true ) {
      uVar26 = (uint)uVar32;
      if ((int)uVar5 <= (int)uVar26) break;
      pfVar29 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
      auVar36 = *pauVar31;
      for (lVar22 = 0; (int)uVar16 != (int)lVar22; lVar22 = lVar22 + 1) {
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ +
                          lVar22 * 4 +
                          local_78 * local_b8._16_8_ *
                          (ulong)((uVar26 & 3) + ((uint)(uVar32 >> 3) & 0x1fffffff) +
                                 (uint)((uVar26 >> 2 & 1) != 0)));
        auVar39._0_4_ = fVar1 * *pfVar29 + auVar36._0_4_;
        auVar39._4_4_ = fVar1 * pfVar29[1] + auVar36._4_4_;
        auVar39._8_4_ = fVar1 * pfVar29[2] + auVar36._8_4_;
        auVar39._12_4_ = fVar1 * pfVar29[3] + auVar36._12_4_;
        pfVar29 = pfVar29 + 4;
        auVar36 = auVar39;
      }
      *pauVar18 = auVar36;
      pauVar18 = pauVar18 + 1;
      uVar32 = (ulong)(uVar26 + 1);
    }
  }
  piVar13 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      local_70 = (ulong)uVar6;
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        free((void *)local_b8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    __m128 _r1 = _mm_loadu_ps(img0 + 4);
                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);
            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }
}